

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O0

MPP_RET avs2d_fill_parameters(Avs2dCtx_t *p_dec,Avs2dSyntax_t *syntax)

{
  byte bVar1;
  Avs2dPicType AVar2;
  RK_U8 RVar3;
  uint uVar4;
  RK_S32 local_60;
  byte local_59;
  WqmParams_Avs2d *wqmp;
  AlfParams_Avs2d *alfp;
  RefParams_Avs2d *refp;
  PicParams_Avs2d *pp;
  Avs2dFrameMgr_t *mgr;
  Avs2dPicHeader_t *ph;
  Avs2dSeqHeader_t *vsh;
  RK_S32 i;
  Avs2dSyntax_t *syntax_local;
  Avs2dCtx_t *p_dec_local;
  
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xfffffffffffffffc | (ulong)((p_dec->vsh).chroma_format & 3);
  *(ulong *)&syntax->pp =
       (*(ulong *)&syntax->pp & 0xfffffffffffc0003) +
       (ulong)((p_dec->vsh).horizontal_size + 7 & 0xfff8) * 4;
  *(ushort *)&(syntax->pp).field_0x4 = (short)(p_dec->vsh).vertical_size + 7U & 0xfff8;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xfff8ffffffffffff | (ulong)((p_dec->vsh).bit_depth - 8 & 7) << 0x30;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xffc7ffffffffffff | (ulong)((p_dec->vsh).bit_depth - 8 & 7) << 0x33;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xfe3fffffffffffff | (ulong)((p_dec->vsh).lcu_size & 7) << 0x36;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xfdffffffffffffff |
       (ulong)((p_dec->vsh).progressive_sequence & 1) << 0x39;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xfbffffffffffffff |
       (ulong)((p_dec->vsh).field_coded_sequence & 1) << 0x3a;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xf7ffffffffffffff |
       (ulong)((p_dec->vsh).enable_mhp_skip & 1) << 0x3b;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xefffffffffffffff | (ulong)((p_dec->vsh).enable_dhp & 1) << 0x3c;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xdfffffffffffffff | (ulong)((p_dec->vsh).enable_wsm & 1) << 0x3d;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0xbfffffffffffffff | (ulong)((p_dec->vsh).enable_amp & 1) << 0x3e;
  *(ulong *)&syntax->pp =
       *(ulong *)&syntax->pp & 0x7fffffffffffffff | (ulong)(p_dec->vsh).enable_nsqt << 0x3f;
  bVar1 = (p_dec->vsh).enable_nsip;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xfffe | bVar1 & 1;
  bVar1 = (p_dec->vsh).enable_2nd_transform;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       ((ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xfffd) + (bVar1 & 1) * 2;
  bVar1 = (p_dec->vsh).enable_sao;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       ((ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xfffb) + (bVar1 & 1) * 4;
  bVar1 = (p_dec->vsh).enable_alf;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       ((ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xfff7) + (bVar1 & 1) * 8;
  bVar1 = (p_dec->vsh).enable_pmvr;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xffef | (bVar1 & 1) << 4;
  bVar1 = (p_dec->vsh).enable_clf;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xffdf | (bVar1 & 1) << 5;
  AVar2 = (p_dec->ph).picture_type;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xfe3f |
       (ushort)((AVar2 & (S_PICTURE|P_PICTURE)) << 6);
  bVar1 = (p_dec->ph).background_reference_flag;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xfdff | (bVar1 & 1) << 9;
  local_59 = 0;
  if ((p_dec->vsh).field_coded_sequence != '\0') {
    local_59 = (p_dec->ph).is_top_field != '\0' ^ 0xff;
  }
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xfbff | (local_59 & 1) << 10;
  bVar1 = (p_dec->ph).fixed_picture_qp;
  (syntax->pp).field_0xa = (syntax->pp).field_0xa;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)*(undefined3 *)&(syntax->pp).field_0x8 & 0xf7ff | (bVar1 & 1) << 0xb;
  uVar4 = *(uint3 *)&(syntax->pp).field_0x8 & 0xf80fff | ((p_dec->ph).picture_qp & 0x7f) << 0xc;
  *(short *)&(syntax->pp).field_0x8 = (short)uVar4;
  (syntax->pp).field_0xa = (char)(uVar4 >> 0x10);
  RVar3 = (p_dec->ph).enable_loop_filter;
  *(undefined2 *)&(syntax->pp).field_0x8 = *(undefined2 *)&(syntax->pp).field_0x8;
  (syntax->pp).field_0xa =
       (syntax->pp).field_0xa & 0xf7 | (byte)(((uint)(RVar3 == '\0') << 0x13) >> 0x10);
  (syntax->pp).alpha_c_offset = (p_dec->ph).alpha_c_offset;
  (syntax->pp).beta_offset = (p_dec->ph).beta_offset;
  (syntax->pp).cur_poc = (p_dec->ph).poi;
  (syntax->refp).ref_pic_num = (p_dec->frm_mgr).num_of_ref;
  memset((syntax->refp).ref_poc_list,0xff,0x80);
  for (vsh._4_4_ = 0; vsh._4_4_ < (int)(uint)(p_dec->frm_mgr).num_of_ref; vsh._4_4_ = vsh._4_4_ + 1)
  {
    if ((p_dec->frm_mgr).refs[vsh._4_4_] == (Avs2dFrame_t *)0x0) {
      local_60 = -1;
    }
    else {
      local_60 = (p_dec->frm_mgr).refs[vsh._4_4_]->poi;
    }
    (syntax->refp).ref_poc_list[vsh._4_4_] = local_60;
  }
  (syntax->alfp).enable_pic_alf_y = (p_dec->ph).enable_pic_alf_y;
  (syntax->alfp).enable_pic_alf_cb = (p_dec->ph).enable_pic_alf_cb;
  (syntax->alfp).enable_pic_alf_cr = (p_dec->ph).enable_pic_alf_cr;
  if ((p_dec->ph).alf_filter_num == '\0') {
    RVar3 = '\0';
  }
  else {
    RVar3 = (p_dec->ph).alf_filter_num + 0xff;
  }
  (syntax->alfp).alf_filter_num_minus1 = RVar3;
  *(undefined8 *)(syntax->alfp).alf_coeff_idx_tab = *(undefined8 *)(p_dec->ph).alf_coeff_idx_tab;
  *(undefined8 *)((syntax->alfp).alf_coeff_idx_tab + 8) =
       *(undefined8 *)((p_dec->ph).alf_coeff_idx_tab + 8);
  memcpy((syntax->alfp).alf_coeff_y,(p_dec->ph).alf_coeff_y,0x240);
  memcpy((syntax->alfp).alf_coeff_cb,(p_dec->ph).alf_coeff_cb,0x24);
  memcpy((syntax->alfp).alf_coeff_cr,(p_dec->ph).alf_coeff_cr,0x24);
  (syntax->wqmp).pic_weight_quant_enable_flag = p_dec->enable_wq;
  (syntax->wqmp).chroma_quant_param_delta_cb = (p_dec->ph).chroma_quant_param_delta_cb;
  (syntax->wqmp).chroma_quant_param_delta_cr = (p_dec->ph).chroma_quant_param_delta_cr;
  memcpy((syntax->wqmp).wq_matrix,p_dec->cur_wq_matrix,0x200);
  return MPP_OK;
}

Assistant:

MPP_RET avs2d_fill_parameters(Avs2dCtx_t *p_dec, Avs2dSyntax_t *syntax)
{
    RK_S32 i = 0;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;
    Avs2dPicHeader_t *ph  = &p_dec->ph;
    Avs2dFrameMgr_t *mgr  = &p_dec->frm_mgr;
    PicParams_Avs2d *pp   = &syntax->pp;
    RefParams_Avs2d *refp = &syntax->refp;
    AlfParams_Avs2d *alfp = &syntax->alfp;
    WqmParams_Avs2d *wqmp = &syntax->wqmp;

    //!< sequence header
    pp->chroma_format_idc          = vsh->chroma_format;
    pp->pic_width_in_luma_samples  = MPP_ALIGN(vsh->horizontal_size, 8);
    pp->pic_height_in_luma_samples = MPP_ALIGN(vsh->vertical_size, 8);
    pp->bit_depth_luma_minus8      = vsh->bit_depth - 8;
    pp->bit_depth_chroma_minus8    = vsh->bit_depth - 8;
    pp->lcu_size                   = vsh->lcu_size;
    pp->progressive_sequence       = vsh->progressive_sequence;
    pp->field_coded_sequence       = vsh->field_coded_sequence;
    pp->multi_hypothesis_skip_enable_flag        = vsh->enable_mhp_skip;
    pp->dual_hypothesis_prediction_enable_flag   = vsh->enable_dhp;
    pp->weighted_skip_enable_flag                = vsh->enable_wsm;
    pp->asymmetrc_motion_partitions_enable_flag  = vsh->enable_amp;
    pp->nonsquare_quadtree_transform_enable_flag = vsh->enable_nsqt;
    pp->nonsquare_intra_prediction_enable_flag   = vsh->enable_nsip;
    pp->secondary_transform_enable_flag          = vsh->enable_2nd_transform;
    pp->sample_adaptive_offset_enable_flag       = vsh->enable_sao;
    pp->adaptive_loop_filter_enable_flag         = vsh->enable_alf;
    pp->pmvr_enable_flag                         = vsh->enable_pmvr;
    pp->cross_slice_loopfilter_enable_flag       = vsh->enable_clf;

    //!< picture header
    pp->picture_type                = ph->picture_type;
    pp->scene_reference_enable_flag = ph->background_reference_flag;
    pp->bottom_field_picture_flag   = (vsh->field_coded_sequence) && (!ph->is_top_field);
    // pp->bottom_field_picture_flag   = !ph->is_top_field;
    pp->fixed_picture_qp            = ph->fixed_picture_qp;
    pp->picture_qp                  = ph->picture_qp;
    pp->loop_filter_disable_flag    = !ph->enable_loop_filter;
    pp->alpha_c_offset              = ph->alpha_c_offset;
    pp->beta_offset                 = ph->beta_offset;

    //!< current poc
    pp->cur_poc = ph->poi;

    //!< picture reference params
    refp->ref_pic_num = mgr->num_of_ref;
    memset(refp->ref_poc_list, -1, sizeof(refp->ref_poc_list));
    for (i = 0; i < mgr->num_of_ref; i++) {
        refp->ref_poc_list[i] = mgr->refs[i] ? mgr->refs[i]->poi : -1;
    }

    //!< picture alf params
    alfp->enable_pic_alf_y  = ph->enable_pic_alf_y;
    alfp->enable_pic_alf_cb = ph->enable_pic_alf_cb;
    alfp->enable_pic_alf_cr = ph->enable_pic_alf_cr;
    alfp->alf_filter_num_minus1 = (ph->alf_filter_num > 0) ? (ph->alf_filter_num - 1) : 0;
    memcpy(alfp->alf_coeff_idx_tab, ph->alf_coeff_idx_tab, sizeof(ph->alf_coeff_idx_tab));
    memcpy(alfp->alf_coeff_y, ph->alf_coeff_y, sizeof(ph->alf_coeff_y));
    memcpy(alfp->alf_coeff_cb, ph->alf_coeff_cb, sizeof(ph->alf_coeff_cb));
    memcpy(alfp->alf_coeff_cr, ph->alf_coeff_cr, sizeof(ph->alf_coeff_cr));

    //!< picture wqm params
    wqmp->pic_weight_quant_enable_flag = p_dec->enable_wq;
    wqmp->chroma_quant_param_delta_cb = ph->chroma_quant_param_delta_cb;
    wqmp->chroma_quant_param_delta_cr = ph->chroma_quant_param_delta_cr;
    memcpy(wqmp->wq_matrix, p_dec->cur_wq_matrix, sizeof(p_dec->cur_wq_matrix));

    return MPP_OK;
}